

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_time.cc
# Opt level: O2

void * CSocekt::ServerTimerQueueMonitorThread(void *threadData)

{
  long lVar1;
  long lVar2;
  time_t tVar3;
  undefined8 extraout_RAX;
  list<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_> m_lsIdleList;
  _List_base<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_> local_30;
  
  lVar1 = *(long *)((long)threadData + 8);
  do {
    if (g_stopEvent != 0) {
      return (void *)0x0;
    }
    if (*(long *)(lVar1 + 0x1a68) != 0) {
      lVar2 = *(long *)(lVar1 + 0x1a70);
      tVar3 = time((time_t *)0x0);
      if (lVar2 < tVar3) {
        local_30._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
        local_30._M_impl._M_node._M_size = 0;
        local_30._M_impl._M_node.super__List_node_base._M_prev =
             local_30._M_impl._M_node.super__List_node_base._M_next;
        muduo::MutexLock::lock((MutexLock *)(lVar1 + 0x1a08));
        std::__cxx11::_List_base<_STRUC_MSG_HEADER_*,_std::allocator<_STRUC_MSG_HEADER_*>_>::
        _M_clear(&local_30);
        _Unwind_Resume(extraout_RAX);
      }
    }
    usleep(500000);
  } while( true );
}

Assistant:

void* CSocekt::ServerTimerQueueMonitorThread(void* threadData)
{
    ThreadItem *pThread = static_cast<ThreadItem*>(threadData);
    CSocekt *pSocketObj = pThread->_pThis;

    time_t absolute_time,cur_time;
    int err;

    while(g_stopEvent == 0) //不退出
    {
        //这里没互斥判断，所以只是个初级判断，目的至少是队列为空时避免系统损耗		
		if(pSocketObj->m_cur_size_ > 0)//队列不为空，有内容
        {
			//时间队列中最近发生事情的时间放到 absolute_time里；
            absolute_time = pSocketObj->m_timer_value_; //这个可是省了个互斥，十分划算
            cur_time = time(NULL);
            if(absolute_time < cur_time)
            {
                //时间到了，可以处理了
                std::list<LPSTRUC_MSG_HEADER> m_lsIdleList; //将到期的连接放入到这个队列中
                LPSTRUC_MSG_HEADER result;

                pSocketObj->m_timequeueMutex.lock();  
                if(err != 0) LOG_ERROR << "CSocekt::ServerTimerQueueMonitorThread()中pthread_mutex_lock()失败，返回的错误码为" << err;//有问题，要及时报告
                while ((result = pSocketObj->GetOverTimeTimer(cur_time)) != NULL) //一次性的把所有超时节点都拿过来
				{
					m_lsIdleList.push_back(result); 
				}//end while
                pSocketObj->m_timequeueMutex.unlock();  
                if(err != 0) LOG_ERROR << "CSocekt::ServerTimerQueueMonitorThread()中pthread_mutex_lock()失败，返回的错误码为" << err;//有问题，要及时报告
                LPSTRUC_MSG_HEADER tmpmsg;
                while(!m_lsIdleList.empty())
                {
                    tmpmsg = m_lsIdleList.front();
					m_lsIdleList.pop_front(); 
                    pSocketObj->procPingTimeOutChecking(tmpmsg,cur_time); //这里需要检查心跳超时问题
                } //end while(!m_lsIdleList.empty())
            }
        } //end if(pSocketObj->m_cur_size_ > 0)
        
        usleep(500 * 1000); //为简化问题，我们直接每次休息500毫秒
    } //end while

    return (void*)0;
}